

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext_p.h
# Opt level: O0

QOpenGLContext *
QEGLPlatformContext::createFrom<QXcbEglContext>
          (EGLContext context,EGLDisplay contextDisplay,EGLDisplay platformDisplay,
          QOpenGLContext *shareContext)

{
  QOpenGLContextPrivate *pQVar1;
  void *pvVar2;
  long in_RCX;
  QPlatformOpenGLContext *in_RDX;
  QPlatformOpenGLContext *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  QXcbEglContext *platformContext;
  QOpenGLContextPrivate *contextPrivate;
  QOpenGLContext *resultingContext;
  QPlatformOpenGLContext *shareHandle;
  char *in_stack_ffffffffffffff68;
  QOpenGLContext *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QMessageLogger *in_stack_ffffffffffffff80;
  QOpenGLContext *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (void *)0x0) {
    local_30 = (QOpenGLContext *)0x0;
  }
  else if (in_RSI == in_RDX) {
    if (in_RCX != 0) {
      QOpenGLContext::handle();
    }
    local_30 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(local_30,(QObject *)0x0);
    pQVar1 = QOpenGLContextPrivate::get(in_stack_ffffffffffffff70);
    pvVar2 = operator_new(0x78);
    QXcbEglContext::QXcbEglContext((QXcbEglContext *)in_stack_ffffffffffffff70);
    ::QEGLPlatformContext::adopt(pvVar2,in_RDI,in_RSI);
    QOpenGLContextPrivate::adopt((QPlatformOpenGLContext *)pQVar1);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (local_28,"QEGLPlatformContext: Cannot adopt context from different display");
    local_30 = (QOpenGLContext *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static QOpenGLContext *createFrom(EGLContext context, EGLDisplay contextDisplay,
            EGLDisplay platformDisplay, QOpenGLContext *shareContext)
    {
        if (!context)
            return nullptr;

        // A context belonging to a given EGLDisplay cannot be used with another one
        if (contextDisplay != platformDisplay) {
            qWarning("QEGLPlatformContext: Cannot adopt context from different display");
            return nullptr;
        }

        QPlatformOpenGLContext *shareHandle = shareContext ? shareContext->handle() : nullptr;

        auto *resultingContext = new QOpenGLContext;
        auto *contextPrivate = QOpenGLContextPrivate::get(resultingContext);
        auto *platformContext = new T;
        platformContext->adopt(context, contextDisplay, shareHandle);
        contextPrivate->adopt(platformContext);
        return resultingContext;
    }